

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O0

void CMconn_fail_conditions(CMConnection conn)

{
  CMConnection in_RDI;
  CMCondition cond_list;
  CMControlList cl;
  CMCondition cond;
  CManager cm;
  
  cm = (CManager)in_RDI->cm->control_list;
  set_debug_flag((CManager)0x129927);
  for (cond = *(CMCondition *)&cm->abort_read_ahead; cond != (CMCondition)0x0; cond = cond->next) {
    if (cond->conn == in_RDI) {
      cond->failed = 1;
      CMCondition_trigger(cm,cond,(CMControlList)0x12996e);
    }
  }
  if (*(int *)((long)&cm->cm_buffer_list + 4) != 0) {
    CMwake_server_thread(cm);
  }
  return;
}

Assistant:

extern void
CMconn_fail_conditions(CMConnection conn)
{
    CMControlList cl = conn->cm->control_list;
    CMCondition cond_list;
    set_debug_flag(conn->cm);
    cond_list = cl->condition_list;
    while(cond_list != NULL) {
	if (cond_list->conn == conn) {
	    cond_list->failed = 1;
	    CMCondition_trigger(conn->cm, cond_list, cl);
	}
	cond_list = cond_list->next;
    }
    if (cl->cond_polling) {
	/* wake the server thread in case we're not him */
	CMwake_server_thread(conn->cm);
    }
}